

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O2

void __thiscall
TPZEquationFilter::ScatterInternal<double>
          (TPZEquationFilter *this,TPZFMatrix<double> *vsmall,TPZFMatrix<double> *vexpand)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  long col;
  int64_t i;
  long lVar4;
  double extraout_XMM0_Qa;
  
  lVar3 = this->fNumEq;
  if (this->fIsActive != false) {
    lVar3 = (this->fActiveEqs).fNElements;
  }
  if ((((vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == lVar3) &&
      ((vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == this->fNumEq)) &&
     ((vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <=
      (vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    if ((this->fIsActive & 1U) == 0) {
      TPZFMatrix<double>::operator=(vexpand,vsmall);
      return;
    }
    (*(vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (vexpand);
    col = 0;
    if (lVar3 < 1) {
      lVar3 = col;
    }
    lVar1 = (vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar1 < 1) {
      lVar1 = col;
    }
    for (; col != lVar1; col = col + 1) {
      for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
        (*(vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(vsmall,lVar4,col);
        pdVar2 = TPZFMatrix<double>::operator()(vexpand,(this->fActiveEqs).fStore[lVar4],col);
        *pdVar2 = extraout_XMM0_Qa;
      }
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) const [TVar = double]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Incompatible dimensions\nAborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZEquationFilter.cpp"
             ,0x4a);
}

Assistant:

void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &vsmall,
                     TPZFMatrix<TVar> &vexpand) const {
  int64_t neqcondense = this->NActiveEquations();
  if (vsmall.Rows() != neqcondense || vexpand.Rows() != fNumEq ||
      vsmall.Cols() > vexpand.Cols()) {
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Incompatible dimensions\nAborting...\n";
    DebugStop();
  }
  if (!IsActive()) {
    vexpand = vsmall;
    return;
  }
  vexpand.Zero();

#ifdef PZDEBUG
  {
    for (int64_t i = 0; i < neqcondense; i++) {
      if (fActiveEqs[i] >= fNumEq) {
        DebugStop();
      }
    }
  }
#endif
  const auto ncols = vsmall.Cols();
  for(auto j = 0; j < ncols; j++)
    for (int64_t i = 0; i < neqcondense; i++)
      vexpand(fActiveEqs[i], j) = vsmall.GetVal(i, j);
}